

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

Maybe<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry_&> __thiscall
kj::
Table<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>>
::find<0ul,unsigned_long_const&>
          (Table<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>>
           *this,unsigned_long *params)

{
  HashIndex<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Callbacks> *pHVar1;
  NullableValue<unsigned_long> *other;
  unsigned_long *puVar2;
  Entry *t;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 in_RDX;
  ArrayPtr<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry> AVar3;
  unsigned_long *pos;
  Entry *local_50;
  unsigned_long *local_48;
  Maybe<unsigned_long> local_40;
  undefined1 local_30 [8];
  NullableValue<unsigned_long> _pos583;
  unsigned_long *params_local;
  Table<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>_>
  *this_local;
  
  _pos583.field_1 = in_RDX;
  pHVar1 = get<0ul,kj::HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>&>
                     ((HashIndex<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>
                       *)(params + 4));
  AVar3 = Vector<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry>::asPtr
                    ((Vector<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry>
                      *)params);
  fwd<unsigned_long_const&>((unsigned_long *)_pos583.field_1);
  local_50 = AVar3.ptr;
  local_48 = (unsigned_long *)AVar3.size_;
  AVar3.size_ = (size_t)local_50;
  AVar3.ptr = (Entry *)pHVar1;
  HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>::
  find<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Entry,unsigned_long_const&>
            ((HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>
              *)&local_40,AVar3,local_48);
  other = _::readMaybe<unsigned_long>(&local_40);
  _::NullableValue<unsigned_long>::NullableValue((NullableValue<unsigned_long> *)local_30,other);
  Maybe<unsigned_long>::~Maybe(&local_40);
  puVar2 = _::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_30);
  if (puVar2 == (unsigned_long *)0x0) {
    Maybe<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry_&>::Maybe
              ((Maybe<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry_&>
                *)this);
  }
  else {
    puVar2 = _::NullableValue<unsigned_long>::operator*((NullableValue<unsigned_long> *)local_30);
    t = Vector<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry>::
        operator[]((Vector<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry>
                    *)params,*puVar2);
    Maybe<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry_&>::Maybe
              ((Maybe<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry_&>
                *)this,t);
  }
  _::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_30);
  return (Maybe<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry_&>)
         (Entry *)this;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}